

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::setExpanded(QToolBarLayout *this,bool exp)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QWidget *this_00;
  QMainWindow *pQVar4;
  QMainWindowLayout *this_01;
  byte in_SIL;
  uint __sig;
  QMainWindowLayoutState *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_0000000f;
  QToolBarAreaLayout *in_stack_00000010;
  QMainWindowLayout *layout;
  QMainWindow *win;
  QWidget *tb;
  QRect rect;
  QList<int> path;
  QSize *in_stack_000000c0;
  QToolBarLayout *in_stack_000000c8;
  uint7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar5;
  QLayout *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb8;
  QMainWindowLayoutState *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  this_02 = in_RDI;
  QLayout::parentWidget(in_stack_ffffffffffffffa0);
  this_00 = &qobject_cast<QToolBar*>((QObject *)0x6ff66b)->super_QWidget;
  if ((this_00 != (QWidget *)0x0) &&
     (((bVar2 & 1) != ((byte)(in_RDI->toolBarAreaLayout).rect.y1.m_i & 1) ||
      (bVar3 = QWidget::isWindow((QWidget *)
                                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)),
      bVar3)))) {
    *(byte *)&(in_RDI->toolBarAreaLayout).rect.y1.m_i = bVar2 & 1;
    __sig = (uint)((byte)(in_RDI->toolBarAreaLayout).rect.y1.m_i & 1);
    QAbstractButton::setChecked
              ((QAbstractButton *)in_stack_ffffffffffffffa0,SUB81((ulong)in_RDI >> 0x38,0));
    QWidget::parentWidget((QWidget *)0x6ff6d5);
    pQVar4 = qobject_cast<QMainWindow*>((QObject *)0x6ff6dd);
    if (pQVar4 != (QMainWindow *)0x0) {
      bVar3 = QWidget::isWindow((QWidget *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      bVar5 = false;
      if (!bVar3) {
        bVar5 = QMainWindow::isAnimated((QMainWindow *)(ulong)in_stack_ffffffffffffff90);
      }
      *(bool *)((long)&(in_RDI->toolBarAreaLayout).rect.y1.m_i + 1) = bVar5;
      this_01 = qt_mainwindow_layout((QMainWindow *)0x6ff72c);
      if (((in_RDI->toolBarAreaLayout).rect.y1.m_i & 1) == 0) {
        QMainWindowLayoutState::indexOf
                  (this_02,(QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffffb8));
        bVar3 = QList<int>::isEmpty((QList<int> *)0x6ff797);
        if (!bVar3) {
          QMainWindowLayoutState::itemRect
                    ((QMainWindowLayoutState *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),
                     (QList<int> *)this_00);
          QRect::size((QRect *)this_01);
          layoutActions(in_stack_000000c8,in_stack_000000c0);
        }
        QList<int>::~QList((QList<int> *)0x6ff7fb);
      }
      else {
        QWidget::raise(this_00,__sig);
      }
      QToolBarAreaLayout::apply(in_stack_00000010,in_stack_0000000f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarLayout::setExpanded(bool exp)
{
    QWidget *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    if (exp == expanded && !tb->isWindow())
        return;

    expanded = exp;
    extension->setChecked(expanded);

    if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget())) {
#if !QT_CONFIG(dockwidget)
        animating = false;
#else
        animating = !tb->isWindow() && win->isAnimated();
#endif
        QMainWindowLayout *layout = qt_mainwindow_layout(win);
        if (expanded) {
            tb->raise();
        } else {
            QList<int> path = layout->layoutState.indexOf(tb);
            if (!path.isEmpty()) {
                QRect rect = layout->layoutState.itemRect(path);
                layoutActions(rect.size());
            }
        }
        layout->layoutState.toolBarAreaLayout.apply(animating);
    }
}